

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

AssignmentPatternExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AssignmentPatternExpressionSyntax,slang::syntax::AssignmentPatternExpressionSyntax_const&>
          (BumpAllocator *this,AssignmentPatternExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  DataTypeSyntax *pDVar3;
  undefined4 uVar4;
  AssignmentPatternExpressionSyntax *pAVar5;
  
  pAVar5 = (AssignmentPatternExpressionSyntax *)allocate(this,0x28,8);
  uVar4 = *(undefined4 *)
           &(args->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.parent;
  pSVar2 = (args->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode
  ;
  pDVar3 = args->type;
  (pAVar5->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind =
       (args->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pAVar5->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4 =
       uVar4;
  (pAVar5->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = pSVar1;
  (pAVar5->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       pSVar2;
  pAVar5->type = pDVar3;
  (pAVar5->pattern).ptr = (args->pattern).ptr;
  return pAVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }